

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetMin.c
# Opt level: O2

int Saig_ManRetimeUnsatCore(Aig_Man_t *p,int fVerbose)

{
  int *piVar1;
  int iVar2;
  Cnf_Dat_t *p_00;
  sat_solver *s;
  Sto_Man_t *pCnf;
  Intp_Man_t *p_01;
  Vec_Int_t *p_02;
  void *__ptr;
  int *piVar3;
  void *pvVar4;
  long lVar5;
  int iVar6;
  char *__assertion;
  uint uVar7;
  uint local_40;
  
  p_00 = Cnf_DeriveSimpleForRetiming(p);
  s = sat_solver_new();
  sat_solver_store_alloc(s);
  sat_solver_setnvars(s,p_00->nVars);
  lVar5 = 0;
  do {
    if (p_00->nClauses <= lVar5) {
      sat_solver_store_mark_roots(s);
      iVar6 = 0;
      iVar2 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,1000000,0,0,0);
      if (iVar2 == -1) {
        pCnf = (Sto_Man_t *)sat_solver_store_release(s);
        sat_solver_delete(s);
        p_01 = Intp_ManAlloc();
        p_02 = (Vec_Int_t *)Intp_ManUnsatCore(p_01,pCnf,0,0);
        Intp_ManFree(p_01);
        Sto_ManFree(pCnf);
        __ptr = calloc(1,(long)p_00->nVars << 2);
        uVar7 = 0;
        for (; iVar6 < p_02->nSize; iVar6 = iVar6 + 1) {
          iVar2 = Vec_IntEntry(p_02,iVar6);
          piVar1 = p_00->pClauses[(long)iVar2 + 1];
          for (piVar3 = p_00->pClauses[iVar2]; piVar3 < piVar1; piVar3 = piVar3 + 1) {
            uVar7 = uVar7 + (*(int *)((long)__ptr + (long)(*piVar3 >> 1) * 4) == 0);
            *(undefined4 *)((long)__ptr + (long)(*piVar3 >> 1) * 4) = 1;
          }
        }
        iVar2 = -1;
        local_40 = 0;
        for (iVar6 = 0; iVar6 < p->vCos->nSize; iVar6 = iVar6 + 1) {
          pvVar4 = Vec_PtrEntry(p->vCos,iVar6);
          if ((-1 < (long)p_00->pVarNums[*(int *)((long)pvVar4 + 0x24)]) &&
             (*(int *)((long)__ptr + (long)p_00->pVarNums[*(int *)((long)pvVar4 + 0x24)] * 4) == 1))
          {
            if (iVar2 == -1) {
              iVar2 = iVar6;
            }
            local_40 = local_40 + 1;
          }
        }
        if (fVerbose != 0) {
          printf("UNSAT core: %d clauses, %d variables, %d POs.  ",(ulong)(uint)p_02->nSize,
                 (ulong)uVar7,(ulong)local_40);
        }
        free(__ptr);
        Vec_IntFree(p_02);
        Cnf_DataFree(p_00);
        return iVar2;
      }
      if (iVar2 == 0) {
        __assertion = "RetValue != l_Undef";
        uVar7 = 0x7d;
      }
      else {
        __assertion = "RetValue == l_False";
        uVar7 = 0x7e;
      }
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigRetMin.c"
                    ,uVar7,"int Saig_ManRetimeUnsatCore(Aig_Man_t *, int)");
    }
    iVar2 = sat_solver_addclause(s,p_00->pClauses[lVar5],p_00->pClauses[lVar5 + 1]);
    lVar5 = lVar5 + 1;
  } while (iVar2 != 0);
  Cnf_DataFree(p_00);
  sat_solver_delete(s);
  return -1;
}

Assistant:

int Saig_ManRetimeUnsatCore( Aig_Man_t * p, int fVerbose )
{
    int fVeryVerbose = 0;
    int nConfLimit = 1000000;
    void * pSatCnf = NULL; 
    Intp_Man_t * pManProof;
    Vec_Int_t * vCore = NULL;
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    Aig_Obj_t * pObj;
    int * pClause1, * pClause2, * pLit, * pVars;
    int i, RetValue, iBadPo, iClause, nVars, nPos;
    // create the SAT solver
    pCnf = Cnf_DeriveSimpleForRetiming( p );
    pSat = sat_solver_new();
    sat_solver_store_alloc( pSat ); 
    sat_solver_setnvars( pSat, pCnf->nVars );
    for ( i = 0; i < pCnf->nClauses; i++ )
    {
        if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
        {
            Cnf_DataFree( pCnf );
            sat_solver_delete( pSat );
            return -1;
        }
    }
    sat_solver_store_mark_roots( pSat ); 
    // solve the problem
    RetValue = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    assert( RetValue != l_Undef );
    assert( RetValue == l_False );
    pSatCnf = sat_solver_store_release( pSat ); 
    sat_solver_delete( pSat );
    // derive the UNSAT core
    pManProof = Intp_ManAlloc();
    vCore = (Vec_Int_t *)Intp_ManUnsatCore( pManProof, (Sto_Man_t *)pSatCnf, 0, fVeryVerbose );
    Intp_ManFree( pManProof );
    Sto_ManFree( (Sto_Man_t *)pSatCnf );
    // derive the set of variables on which the core depends
    // collect the variable numbers
    nVars = 0;
    pVars = ABC_ALLOC( int, pCnf->nVars );
    memset( pVars, 0, sizeof(int) * pCnf->nVars );
    Vec_IntForEachEntry( vCore, iClause, i )
    {
        pClause1 = pCnf->pClauses[iClause];
        pClause2 = pCnf->pClauses[iClause+1];
        for ( pLit = pClause1; pLit < pClause2; pLit++ )
        {
            if ( pVars[ (*pLit) >> 1 ] == 0 )
                nVars++;
            pVars[ (*pLit) >> 1 ] = 1;
            if ( fVeryVerbose )
            printf( "%s%d ", ((*pLit) & 1)? "-" : "+", (*pLit) >> 1 );
        }
        if ( fVeryVerbose )
        printf( "\n" );
    }
    // collect the nodes
    if ( fVeryVerbose ) {
      Aig_ManForEachObj( p, pObj, i )
          if ( pCnf->pVarNums[pObj->Id] >= 0 && pVars[ pCnf->pVarNums[pObj->Id] ] == 1 )
          {
              Aig_ObjPrint( p, pObj );
              printf( "\n" );
          }
    }
    // pick the first PO in the list
    nPos = 0;
    iBadPo = -1;
    Aig_ManForEachCo( p, pObj, i )
        if ( pCnf->pVarNums[pObj->Id] >= 0 && pVars[ pCnf->pVarNums[pObj->Id] ] == 1 )
        {
            if ( iBadPo == -1 )
                iBadPo = i;
            nPos++;
        }
    if ( fVerbose )
        printf( "UNSAT core: %d clauses, %d variables, %d POs.  ", Vec_IntSize(vCore), nVars, nPos );
    ABC_FREE( pVars );
    Vec_IntFree( vCore );
    Cnf_DataFree( pCnf );
    return iBadPo;
}